

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::GradientCostCase::genOccludedGeometry
          (ObjectData *__return_storage_ptr__,GradientCostCase *this)

{
  vector<float,_std::allocator<float>_> local_150;
  string local_128;
  string local_108;
  ProgramSources local_e8;
  GradientCostCase *local_18;
  GradientCostCase *this_local;
  
  local_18 = this;
  this_local = (GradientCostCase *)__return_storage_ptr__;
  Performance::(anonymous_namespace)::Utils::getInstanceNoiseVertexShader_abi_cxx11_();
  Performance::(anonymous_namespace)::Utils::getDepthAsRedFragmentShader_abi_cxx11_();
  glu::makeVtxFragSources(&local_e8,&local_108,&local_128);
  Utils::getFullscreenQuadWithGradient(&local_150,this->m_gradientDistance,1.0);
  ObjectData::ObjectData(__return_storage_ptr__,&local_e8,&local_150);
  std::vector<float,_std::allocator<float>_>::~vector(&local_150);
  glu::ProgramSources::~ProgramSources(&local_e8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccludedGeometry	(void) const
	{
		return ObjectData(glu::makeVtxFragSources(Utils::getInstanceNoiseVertexShader(), Utils::getDepthAsRedFragmentShader()), Utils::getFullscreenQuadWithGradient(m_gradientDistance, 1.0f));
	}